

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoundMap.cpp
# Opt level: O0

void __thiscall AI::SoundMap::SoundMap(SoundMap *this,Vector2<int> gridSize,float resolution)

{
  uint size;
  float resolution_local;
  SoundMap *this_local;
  Vector2<int> gridSize_local;
  
  this->gridSize = gridSize;
  this->resolution = resolution;
  std::vector<AI::Cell,_std::allocator<AI::Cell>_>::vector(&this->grid);
  std::vector<AI::SoundSource,_std::allocator<AI::SoundSource>_>::vector(&this->sources);
  this->nextSourceId = 0;
  this_local._0_4_ = gridSize.x;
  this_local._4_4_ = gridSize.y;
  std::vector<AI::Cell,_std::allocator<AI::Cell>_>::resize
            (&this->grid,(ulong)(uint)((int)this_local * this_local._4_4_));
  return;
}

Assistant:

SoundMap::SoundMap(Vector2<int> gridSize, float resolution)
		: gridSize{gridSize}, resolution{resolution}
	{
		unsigned int size = gridSize.x * gridSize.y;
		
		grid.resize(size);		
	}